

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall vera::Vbo::render(Vbo *this,Shader *_shader)

{
  Shader *_shader_local;
  Vbo *this_local;
  
  if ((this->m_isUploaded & 1U) == 0) {
    upload(this);
  }
  if (0 < this->m_nVertices) {
    glBindBuffer(0x8892,this->m_glVertexBuffer);
  }
  if (0 < this->m_nIndices) {
    glBindBuffer(0x8893,this->m_glIndexBuffer);
  }
  Shader::use(_shader);
  VertexLayout::enable(this->m_vertexLayout,_shader);
  if (this->m_drawMode == 0) {
    glEnable(0x8861);
    glEnable(0x8642);
  }
  if (this->m_nIndices < 1) {
    if (0 < this->m_nVertices) {
      glDrawArrays(this->m_drawMode,0,this->m_nVertices);
    }
  }
  else {
    glDrawElements(this->m_drawMode,this->m_nIndices,0x1405,0);
  }
  glBindBuffer(0x8892,0);
  return;
}

Assistant:

void Vbo::render(Shader* _shader) {

    // Ensure that geometry is buffered into GPU
    if (!m_isUploaded)
        upload();

    // Bind buffers for drawing
    if (m_nVertices > 0)
        glBindBuffer(GL_ARRAY_BUFFER, m_glVertexBuffer);

    if (m_nIndices > 0)
        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_glIndexBuffer);

    // Enable shader program
    _shader->use();

    // Enable vertex attribs via vertex layout object
    m_vertexLayout->enable(_shader);

#if !defined(PLATFORM_RPI) && !defined(DRIVER_GBM) && !defined(_WIN32) && !defined(__EMSCRIPTEN__)
    if (m_drawMode == GL_POINTS) {
        glEnable(GL_POINT_SPRITE);
        glEnable(GL_VERTEX_PROGRAM_POINT_SIZE);
    }
#endif

    // Draw as elements or arrays
    if (m_nIndices > 0)
        #if defined(PLATFORM_RPI) || defined(DRIVER_GBM) || defined(__EMSCRIPTEN__)
        glDrawElements(m_drawMode, m_nIndices, GL_UNSIGNED_SHORT, 0);
        #else
        glDrawElements(m_drawMode, m_nIndices, GL_UNSIGNED_INT, 0);
        #endif
    else if (m_nVertices > 0)
        glDrawArrays(m_drawMode, 0, m_nVertices);

    glBindBuffer(GL_ARRAY_BUFFER, 0);
}